

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  Level level;
  LineNumber line;
  Logger *pLVar1;
  Writer *pWVar2;
  ostream *poVar3;
  allocator local_1ea;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  LogMessage msg;
  
  if (this->m_proceed == true) {
    if (this->m_msg == (LogMessage *)0x0) {
      level = this->m_level;
      std::__cxx11::string::string((string *)&local_1e8,this->m_file,&local_1e9);
      line = this->m_line;
      std::__cxx11::string::string((string *)&local_1c8,this->m_func,&local_1ea);
      LogMessage::LogMessage
                (&msg,level,&local_1e8,line,&local_1c8,this->m_verboseLevel,this->m_logger);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      local_1e8._M_dataplus._M_p._0_1_ = this->m_proceed;
      local_1e8.field_2._M_allocated_capacity._0_4_ = this->m_dispatchAction;
      local_1e8._M_string_length = (size_type)&msg;
      LogDispatcher::dispatch((LogDispatcher *)&local_1e8);
      LogMessage::~LogMessage(&msg);
    }
    else {
      msg.m_file._M_string_length._0_4_ = this->m_dispatchAction;
      msg.m_level._0_1_ = 1;
      msg.m_file._M_dataplus._M_p = (pointer)this->m_msg;
      LogDispatcher::dispatch((LogDispatcher *)&msg);
    }
  }
  pLVar1 = this->m_logger;
  if (pLVar1 != (Logger *)0x0) {
    std::__cxx11::string::string((string *)&msg,"",(allocator *)&local_1e8);
    std::__cxx11::stringbuf::str((string *)&pLVar1->field_0x58);
    std::__cxx11::string::~string((string *)&msg);
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed == true) && (this->m_level == Fatal)) &&
     ((*(byte *)(elStorage + 0x18) & 8) == 0)) {
    msg.m_file.field_2._M_allocated_capacity = (size_type)this->m_file;
    msg.m_file.field_2._8_8_ = this->m_line;
    msg.m_line = (LineNumber)this->m_func;
    msg._0_8_ = &PTR__Writer_00135bd0;
    msg.m_file._M_dataplus._M_p = (pointer)0x0;
    msg.m_file._M_string_length._0_4_ = 0x20;
    msg.m_func._M_dataplus._M_p._0_2_ = 0;
    msg.m_func._M_string_length = 0;
    msg.m_func.field_2._M_local_buf[0] = '\0';
    msg.m_func.field_2._8_8_ = 0;
    msg._80_8_ = (long)"reason: %s\n" + 0xb;
    msg.m_logger._0_4_ = 2;
    msg.m_message._M_dataplus._M_p = (pointer)0x0;
    msg.m_message._M_string_length = 0;
    msg.m_message.field_2._M_allocated_capacity = 0;
    construct((Writer *)&msg,1,"default");
    pWVar2 = operator<<((Writer *)&msg,(char (*) [45])"Aborting application. Reason: Fatal log at ["
                       );
    pWVar2 = operator<<(pWVar2,&this->m_file);
    pWVar2 = operator<<(pWVar2,(char (*) [2])":");
    pWVar2 = operator<<(pWVar2,&this->m_line);
    operator<<(pWVar2,(char (*) [2])"]");
    ~Writer((Writer *)&msg);
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar3 = std::operator<<((ostream *)&msg.m_file._M_string_length,"Fatal log at [");
    poVar3 = std::operator<<(poVar3,this->m_file);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"]");
    poVar3 = std::operator<<(poVar3," If you wish to disable \'abort on fatal log\' please use ");
    std::operator<<(poVar3,
                    "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)");
    std::__cxx11::stringbuf::str();
    abort();
  }
  this->m_proceed = false;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    if (m_msg == nullptr) {
      LogMessage msg(m_level, m_file, m_line, m_func, m_verboseLevel,
                     m_logger);
      base::LogDispatcher(m_proceed, &msg, m_dispatchAction).dispatch();
    } else {
      base::LogDispatcher(m_proceed, m_msg, m_dispatchAction).dispatch();
    }
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}